

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_gc_mark_external_refs_WRAP(WorkerP *w,Task *__dq_head,TD_lddmc_gc_mark_external_refs *t)

{
  uint64_t arg_1;
  long lVar1;
  uint64_t *puStack_30;
  
  lVar1 = 0;
  puStack_30 = refs_iter(&lddmc_refs,0,lddmc_refs.refs_size);
  while (puStack_30 != (uint64_t *)0x0) {
    arg_1 = refs_next(&lddmc_refs,&puStack_30,lddmc_refs.refs_size);
    lddmc_gc_mark_rec_SPAWN(w,__dq_head,arg_1);
    __dq_head = __dq_head + 1;
    lVar1 = lVar1 + -1;
  }
  for (; __dq_head = __dq_head + -1, lVar1 != 0; lVar1 = lVar1 + 1) {
    lddmc_gc_mark_rec_SYNC(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&lddmc_refs, 0, lddmc_refs.refs_size);
    while (it != NULL) {
        SPAWN(lddmc_gc_mark_rec, refs_next(&lddmc_refs, &it, lddmc_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}